

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CS248::Application::drawHUD(Application *this)

{
  pointer piVar1;
  allocator local_31;
  string local_30;
  
  OSDText::clear(&this->textManager);
  piVar1 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar1) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  OSDText::render(&this->textManager);
  std::__cxx11::string::string((string *)&local_30,"end Application::drawHUD",&local_31);
  checkGLError(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Application::drawHUD() {
    textManager.clear();
    messages.clear();

    const size_t size = 16;
    const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
    const float y0 = use_hdpi ? 128 : 64;
    const int inc = use_hdpi ? 48 : 24;
    float y = y0 + inc - size;

    textManager.render();

    checkGLError("end Application::drawHUD");
}